

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O2

void __thiscall Header::Header(Header *this,path *path)

{
  uint16_t uVar1;
  
  (this->m_fileContents)._M_dataplus._M_p = (pointer)&(this->m_fileContents).field_2;
  (this->m_fileContents)._M_string_length = 0;
  (this->m_fileContents).field_2._M_local_buf[0] = '\0';
  (this->m_dependancies)._M_h._M_buckets = &(this->m_dependancies)._M_h._M_single_bucket;
  (this->m_dependancies)._M_h._M_bucket_count = 1;
  (this->m_dependancies)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_dependancies)._M_h._M_element_count = 0;
  (this->m_dependancies)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_dependancies)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_dependancies)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::filesystem::__cxx11::path::path(&this->m_fullPath,path);
  std::filesystem::__cxx11::path::filename(&this->m_fileName,path);
  uVar1 = id + 1;
  this->m_id = id;
  id = uVar1;
  return;
}

Assistant:

Header::Header(const fs::path & path)
    :   m_fullPath  (path)
    ,   m_fileName  (path.filename())
    ,   m_id        (id++)
{ }